

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::processWordHelper(Assembler *this,int value)

{
  mapped_type *pmVar1;
  char hB;
  char lB;
  value_type local_1a;
  value_type local_19;
  
  local_1a = (value_type)((uint)value >> 8);
  local_19 = (value_type)value;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_19);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_1a);
  return;
}

Assistant:

void Assembler::processWordHelper(int value) {


    char hB = (((unsigned) value) >> 8) & 0xFF;
    char lB = ((unsigned) value) & 0xFF;

    codeBySection[currentSectionName].push_back(lB);
    codeBySection[currentSectionName].push_back(hB);
    return;

}